

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AstCompiler.cpp
# Opt level: O3

void __thiscall
compiler::CompilerAstWalker::onExitIfStatementAstNode
          (CompilerAstWalker *this,IfStatementAstNode *node)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer *ppuVar2;
  element_type *peVar3;
  pointer puVar4;
  pointer puVar5;
  ulong uVar6;
  pointer pBVar7;
  undefined8 uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  string local_50;
  
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->ifConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->ifConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,
             "onExitIfStatementAstNode encountered if exit statement but ifConditionEvalJumpIndices is empty"
             ,"");
  Error::assertWithPanic(puVar4 != puVar5,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  puVar4 = (peVar3->ifConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (peVar3->ifConditionEvalJumpIndices).
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  lVar9 = (long)puVar5 - (long)puVar4 >> 3;
  if (puVar5 == puVar4) {
LAB_0011bc87:
    uVar11 = lVar9 - 1;
  }
  else {
    uVar6 = puVar4[lVar9 + -1];
    (peVar3->ifConditionEvalJumpIndices).
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = puVar5 + -1;
    if ((node->elseStatement).super__Optional_base<std::shared_ptr<StatementAstNode>,_false,_false>.
        _M_payload.super__Optional_payload<std::shared_ptr<StatementAstNode>,_true,_false,_false>.
        super__Optional_payload_base<std::shared_ptr<StatementAstNode>_>._M_engaged == true) {
      puVar4 = (peVar3->elseStatementStartIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (peVar3->elseStatementStartIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "onExitIfStatementAstNode encountered if exit statement with valid ekse but elseStatementStartIndex is empty"
                 ,"");
      Error::assertWithPanic(puVar4 != puVar5,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      puVar4 = (peVar3->elseStatementStartIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar5 = (peVar3->elseStatementStartIndex).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      lVar9 = (long)puVar5 - (long)puVar4 >> 3;
      if (puVar5 == puVar4) goto LAB_0011bc87;
      uVar12 = puVar4[lVar9 + -1];
      local_50._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_50,
                 "onExitIfStatementAstNode encountered jumpIndex == 0 for after if statement -> jump past else"
                 ,"");
      Error::assertWithPanic(uVar12 != 0,&local_50);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != paVar1) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      peVar3 = (this->ec).super___shared_ptr<compiler::EmissionContext,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      uVar11 = uVar12 - 1;
      pBVar7 = (peVar3->byteCode).
               super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(peVar3->byteCode).
                     super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar7 >> 4;
      if (uVar10 <= uVar11) goto LAB_0011bc90;
      *(ulong *)((long)(pBVar7 + uVar11) + 8) = uVar10;
      ppuVar2 = &(peVar3->elseStatementStartIndex).
                 super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppuVar2 = *ppuVar2 + -1;
    }
    else {
      pBVar7 = (peVar3->byteCode).
               super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar10 = (long)(peVar3->byteCode).
                     super__Vector_base<bytecode::ByteCode,_std::allocator<bytecode::ByteCode>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar7 >> 4;
      uVar12 = uVar10;
    }
    uVar11 = uVar6;
    if (uVar6 < uVar10) {
      *(ulong *)((long)(pBVar7 + uVar6) + 8) = uVar12;
      return;
    }
  }
LAB_0011bc90:
  uVar8 = std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
  __clang_call_terminate(uVar8);
}

Assistant:

void onExitIfStatementAstNode(IfStatementAstNode* node) noexcept override {
    Error::assertWithPanic(!this->ec->ifConditionEvalJumpIndices.empty(),
      "onExitIfStatementAstNode encountered if exit statement but ifConditionEvalJumpIndices is empty");

    std::size_t ifEvalIndex = this->ec->ifConditionEvalJumpIndices.at(this->ec->ifConditionEvalJumpIndices.size() - 1);
    this->ec->ifConditionEvalJumpIndices.pop_back();

    std::size_t jumpIndex;

    if (node->elseStatement) {
      Error::assertWithPanic(!this->ec->elseStatementStartIndex.empty(),
        "onExitIfStatementAstNode encountered if exit statement with valid ekse but elseStatementStartIndex is empty");

      jumpIndex = this->ec->elseStatementStartIndex.at(this->ec->elseStatementStartIndex.size() - 1);

      Error::assertWithPanic(jumpIndex > 0,
        "onExitIfStatementAstNode encountered jumpIndex == 0 for after if statement -> jump past else");

      this->ec->UpdateParameterAtIndex(jumpIndex - 1, this->ec->byteCode.size());

      this->ec->elseStatementStartIndex.pop_back();

    } else {
      jumpIndex = this->ec->byteCode.size();
    }

    this->ec->UpdateParameterAtIndex(ifEvalIndex, jumpIndex);
  }